

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O1

Image * __thiscall
ImageTypeManager::image(Image *__return_storage_ptr__,ImageTypeManager *this,uint8_t type)

{
  _Base_ptr p_Var1;
  imageException *this_00;
  _Base_ptr p_Var2;
  undefined7 in_register_00000011;
  _Rb_tree_header *p_Var3;
  bool bVar4;
  
  p_Var3 = &(this->_image)._M_t._M_impl.super__Rb_tree_header;
  p_Var1 = (this->_image)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var3->_M_header;
  for (; p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[bVar4]) {
    bVar4 = (byte)(char)p_Var1[1]._M_color < type;
    if (!bVar4) {
      p_Var2 = p_Var1;
    }
  }
  p_Var1 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var3) &&
     (p_Var1 = p_Var2, type < (byte)(char)p_Var2[1]._M_color)) {
    p_Var1 = &p_Var3->_M_header;
  }
  if ((_Rb_tree_header *)p_Var1 != p_Var3) {
    __return_storage_ptr__->_vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
    __return_storage_ptr__->_data = (uchar *)0x0;
    __return_storage_ptr__->_type = *(uint8_t *)&p_Var1[2]._M_parent;
    PenguinV_Image::ImageTemplate<unsigned_char>::copy
              (__return_storage_ptr__,(EVP_PKEY_CTX *)&p_Var1[1]._M_parent,
               (EVP_PKEY_CTX *)CONCAT71(in_register_00000011,type));
    return __return_storage_ptr__;
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this_00,"Image is not registered");
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

PenguinV_Image::Image ImageTypeManager::image( uint8_t type ) const
{
    std::map< uint8_t, PenguinV_Image::Image >::const_iterator image = _image.find( type );
    if ( image == _image.cend() )
        throw imageException( "Image is not registered" );

    return image->second;
}